

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall
FxIdentifier::ResolveMember
          (FxIdentifier *this,FCompileContext *ctx,PStruct *classctx,FxExpression **object,
          PStruct *objtype)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *pPVar3;
  long *plVar4;
  FxExpression *pFVar5;
  PField *mem;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  FxClassMember *this_00;
  undefined4 extraout_var_04;
  PClass *pPVar6;
  PClass *pPVar7;
  char *message;
  char *pcVar8;
  FScriptPosition *pFVar9;
  bool bVar10;
  bool bVar11;
  PSymbolTable *symtbl;
  PSymbolTable *local_40;
  FName local_34;
  
  pPVar3 = PClass::RegistrationInfo.MyClass;
  if ((objtype->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
      Class == (PClass *)0x0) {
    iVar2 = (**(objtype->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
               super_DObject._vptr_DObject)(objtype);
    (objtype->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.Class
         = (PClass *)CONCAT44(extraout_var,iVar2);
  }
  pPVar1 = PClassActor::RegistrationInfo.MyClass;
  pPVar7 = (objtype->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject
           .Class;
  bVar10 = pPVar7 != (PClass *)0x0;
  pPVar6 = pPVar7;
  if (pPVar7 != pPVar3 && bVar10) {
    do {
      pPVar6 = pPVar6->ParentClass;
      bVar10 = pPVar6 != (PClass *)0x0;
      if (pPVar6 == pPVar3) break;
    } while (pPVar6 != (PClass *)0x0);
  }
  local_34.Index = (this->Identifier).Index;
  if (local_34.Index == 0x249) {
    if (pPVar7 == (PClass *)0x0) {
      iVar2 = (**(objtype->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
                 super_DObject._vptr_DObject)(objtype);
      (objtype->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
      Class = (PClass *)CONCAT44(extraout_var_00,iVar2);
    }
    pPVar3 = (objtype->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
             super_DObject.Class;
    bVar10 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar10) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar10 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar10) {
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"\'Default\' requires an actor type.")
      ;
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      return (FxExpression *)0x0;
    }
    plVar4 = (long *)FMemArena::Alloc(&FxAlloc,0x38);
    pFVar5 = *object;
    *plVar4 = (long)&PTR__FxExpression_00711370;
    FScriptPosition::FScriptPosition
              ((FScriptPosition *)(plVar4 + 1),&(this->super_FxExpression).ScriptPosition);
    plVar4[3] = 0;
    *(undefined2 *)(plVar4 + 4) = 0x100;
    *(undefined4 *)((long)plVar4 + 0x24) = 3;
    *plVar4 = (long)&PTR__FxClassDefaults_00710790;
    plVar4[5] = (long)pFVar5;
    *(undefined1 *)(plVar4 + 6) = 0;
    *object = (FxExpression *)0x0;
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    pFVar5 = (FxExpression *)(**(code **)(*plVar4 + 0x10))(plVar4,ctx);
    return pFVar5;
  }
  mem = (PField *)
        PSymbolTable::FindSymbolInTable
                  (&(objtype->super_PNamedType).super_PCompoundType.super_PType.Symbols,&local_34,
                   &local_40);
  pPVar3 = PSymbolConst::RegistrationInfo.MyClass;
  if (mem == (PField *)0x0) {
    pcVar8 = FName::NameData.NameArray[(this->Identifier).Index].Text;
    message = "Unknown identifier \'%s\'";
  }
  else {
    if ((mem->super_PSymbol).super_PTypeBase.super_DObject.Class == (PClass *)0x0) {
      iVar2 = (**(mem->super_PSymbol).super_PTypeBase.super_DObject._vptr_DObject)(mem);
      (mem->super_PSymbol).super_PTypeBase.super_DObject.Class =
           (PClass *)CONCAT44(extraout_var_01,iVar2);
    }
    pPVar1 = PField::RegistrationInfo.MyClass;
    pPVar7 = (mem->super_PSymbol).super_PTypeBase.super_DObject.Class;
    bVar11 = pPVar7 != (PClass *)0x0;
    pPVar6 = pPVar7;
    if (pPVar7 != pPVar3 && bVar11) {
      do {
        pPVar6 = pPVar6->ParentClass;
        bVar11 = pPVar6 != (PClass *)0x0;
        if (pPVar6 == pPVar3) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    if (bVar11) {
      pFVar9 = &(this->super_FxExpression).ScriptPosition;
      pcVar8 = "struct";
      if (bVar10) {
        pcVar8 = "class";
      }
      FScriptPosition::Message
                (pFVar9,8,"Resolving name \'%s\' as %s constant\n",
                 FName::NameData.NameArray[(this->Identifier).Index].Text,pcVar8);
      if (*object != (FxExpression *)0x0) {
        (*(*object)->_vptr_FxExpression[1])();
      }
      *object = (FxExpression *)0x0;
      pFVar5 = FxConstant::MakeConstant((PSymbol *)mem,pFVar9);
      return pFVar5;
    }
    if (pPVar7 == (PClass *)0x0) {
      iVar2 = (**(mem->super_PSymbol).super_PTypeBase.super_DObject._vptr_DObject)(mem);
      (mem->super_PSymbol).super_PTypeBase.super_DObject.Class =
           (PClass *)CONCAT44(extraout_var_02,iVar2);
    }
    pPVar6 = PFunction::RegistrationInfo.MyClass;
    pPVar3 = (mem->super_PSymbol).super_PTypeBase.super_DObject.Class;
    bVar11 = pPVar3 != (PClass *)0x0;
    pPVar7 = pPVar3;
    if (pPVar3 != pPVar1 && bVar11) {
      do {
        pPVar7 = pPVar7->ParentClass;
        bVar11 = pPVar7 != (PClass *)0x0;
        if (pPVar7 == pPVar1) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    if (bVar11) {
      if (((mem->Flags & 0x80) != 0) && (ctx->FromDecorate == false)) {
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,0,
                   "Accessing deprecated member variable %s",
                   FName::NameData.NameArray
                   [*(int *)&(mem->super_PSymbol).super_PTypeBase.super_DObject.field_0x24].Text);
      }
      if (((mem->Flags & 0x20) != 0) &&
         (local_40 != &(classctx->super_PNamedType).super_PCompoundType.super_PType.Symbols)) {
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Private member %s not accessible",
                   FName::NameData.NameArray
                   [*(int *)&(mem->super_PSymbol).super_PTypeBase.super_DObject.field_0x24].Text);
        return (FxExpression *)0x0;
      }
      this_00 = (FxClassMember *)FMemArena::Alloc(&FxAlloc,0x40);
      pFVar5 = *object;
      pFVar9 = &(this->super_FxExpression).ScriptPosition;
      if (bVar10) {
        FxClassMember::FxClassMember(this_00,pFVar5,mem,pFVar9);
      }
      else {
        (this_00->super_FxStructMember).super_FxExpression._vptr_FxExpression =
             (_func_int **)&PTR__FxExpression_00711370;
        FScriptPosition::FScriptPosition
                  (&(this_00->super_FxStructMember).super_FxExpression.ScriptPosition,pFVar9);
        (this_00->super_FxStructMember).super_FxExpression.ValueType = (PType *)0x0;
        (this_00->super_FxStructMember).super_FxExpression.isresolved = false;
        (this_00->super_FxStructMember).super_FxExpression.NeedResult = true;
        (this_00->super_FxStructMember).super_FxExpression.ExprType = EFX_StructMember;
        (this_00->super_FxStructMember).super_FxExpression._vptr_FxExpression =
             (_func_int **)&PTR__FxStructMember_00710930;
        (this_00->super_FxStructMember).classx = pFVar5;
        (this_00->super_FxStructMember).membervar = mem;
        (this_00->super_FxStructMember).AddressRequested = false;
        (this_00->super_FxStructMember).AddressWritable = true;
      }
      *object = (FxExpression *)0x0;
      iVar2 = (*(this_00->super_FxStructMember).super_FxExpression._vptr_FxExpression[2])
                        (this_00,ctx);
      return (FxExpression *)CONCAT44(extraout_var_04,iVar2);
    }
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(mem->super_PSymbol).super_PTypeBase.super_DObject._vptr_DObject)(mem);
      (mem->super_PSymbol).super_PTypeBase.super_DObject.Class =
           (PClass *)CONCAT44(extraout_var_03,iVar2);
    }
    pPVar3 = (mem->super_PSymbol).super_PTypeBase.super_DObject.Class;
    bVar10 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar6 && bVar10) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar10 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar6) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    pcVar8 = FName::NameData.NameArray[(this->Identifier).Index].Text;
    message = "Invalid member identifier \'%s\'.\n";
    if (bVar10) {
      message = "Function \'%s\' used without ().\n";
    }
  }
  FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,message,pcVar8);
  if (*object != (FxExpression *)0x0) {
    (*(*object)->_vptr_FxExpression[1])();
  }
  *object = (FxExpression *)0x0;
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxIdentifier::ResolveMember(FCompileContext &ctx, PStruct *classctx, FxExpression *&object, PStruct *objtype)
{
	PSymbol *sym;
	PSymbolTable *symtbl;
	bool isclass = objtype->IsKindOf(RUNTIME_CLASS(PClass));

	if (Identifier == NAME_Default)
	{
		if (!objtype->IsKindOf(RUNTIME_CLASS(PClassActor)))
		{
			ScriptPosition.Message(MSG_ERROR, "'Default' requires an actor type.");
			delete this;
			return nullptr;
		}

		FxExpression * x = new FxClassDefaults(object, ScriptPosition);
		object = nullptr;
		delete this;
		return x->Resolve(ctx);
	}

	if ((sym = objtype->Symbols.FindSymbolInTable(Identifier, symtbl)) != nullptr)
	{
		if (sym->IsKindOf(RUNTIME_CLASS(PSymbolConst)))
		{
			ScriptPosition.Message(MSG_DEBUGLOG, "Resolving name '%s' as %s constant\n", Identifier.GetChars(), isclass ? "class" : "struct");
			delete object;
			object = nullptr;
			return FxConstant::MakeConstant(sym, ScriptPosition);
		}
		else if (sym->IsKindOf(RUNTIME_CLASS(PField)))
		{
			PField *vsym = static_cast<PField*>(sym);

			// We have 4 cases to consider here:
			// 1. The symbol is a static/meta member (not implemented yet) which is always accessible.
			// 2. This is a static function 
			// 3. This is an action function with a restricted self pointer
			// 4. This is a normal member or unrestricted action function.
			if (vsym->Flags & VARF_Deprecated && !ctx.FromDecorate)
			{
				ScriptPosition.Message(MSG_WARNING, "Accessing deprecated member variable %s", vsym->SymbolName.GetChars());
			}
			if ((vsym->Flags & VARF_Private) && symtbl != &classctx->Symbols)
			{
				ScriptPosition.Message(MSG_ERROR, "Private member %s not accessible", vsym->SymbolName.GetChars());
				return nullptr;
			}

			auto x = isclass ? new FxClassMember(object, vsym, ScriptPosition) : new FxStructMember(object, vsym, ScriptPosition);
			object = nullptr;
			return x->Resolve(ctx);
		}
		else
		{
			if (sym->IsKindOf(RUNTIME_CLASS(PFunction)))
			{
				ScriptPosition.Message(MSG_ERROR, "Function '%s' used without ().\n", Identifier.GetChars());
			}
			else
			{
				ScriptPosition.Message(MSG_ERROR, "Invalid member identifier '%s'.\n", Identifier.GetChars());
			}
			delete object;
			object = nullptr;
			return nullptr;
		}
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Unknown identifier '%s'", Identifier.GetChars());
		delete object;
		object = nullptr;
		return nullptr;
	}
}